

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpconvert.cpp
# Opt level: O0

void __thiscall LpConvert::run(LpConvert *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  Options *pOVar6;
  istream *in_RDI;
  Options opts;
  AspifOutput aspif;
  SmodelsConvert smodels;
  SmodelsOutput writer;
  AspifTextOutput text;
  ostream *os;
  istream *in;
  ofstream oFile;
  ifstream iFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  AspifTextOutput *in_stack_fffffffffffffae0;
  ostream *in_stack_fffffffffffffae8;
  SmodelsOutput *in_stack_fffffffffffffaf0;
  ostream *in_stack_fffffffffffffaf8;
  AspifTextOutput *in_stack_fffffffffffffb00;
  undefined1 ext;
  AbstractProgram *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  ErrorHandler err;
  undefined7 in_stack_fffffffffffffb28;
  istream *in_00;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 uVar7;
  byte in_stack_fffffffffffffb3c;
  undefined1 in_stack_fffffffffffffb3d;
  byte in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  Options local_4b4;
  AspifTextOutput local_4b0;
  AspifTextOutput local_460;
  ErrorHandler local_430;
  istream *local_428;
  undefined1 local_410 [512];
  istream local_210 [528];
  
  std::ifstream::ifstream(local_210);
  std::ofstream::ofstream(local_410);
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) &&
     (in_stack_fffffffffffffb3f =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8),
     (bool)in_stack_fffffffffffffb3f)) {
    uVar5 = std::__cxx11::string::c_str();
    std::ifstream::open(local_210,uVar5,8);
    in_stack_fffffffffffffb3e = std::ifstream::is_open();
    if ((in_stack_fffffffffffffb3e & 1) == 0) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x5b,"iFile.is_open()",
                     "Could not open input file!",0);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) &&
     (in_stack_fffffffffffffb3d =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8),
     (bool)in_stack_fffffffffffffb3d)) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    if (!bVar1) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x5e,"input_ != output_",
                     "Input and output must be different!",0);
    }
    uVar5 = std::__cxx11::string::c_str();
    std::ofstream::open(local_410,uVar5,0x10);
    in_stack_fffffffffffffb3c = std::ofstream::is_open();
    if ((in_stack_fffffffffffffb3c & 1) == 0) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x60,"oFile.is_open()",
                     "Could not open output file!",0);
    }
  }
  bVar2 = std::ifstream::is_open();
  uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb38);
  if ((bVar2 & 1) == 0) {
    in_00 = (istream *)&std::cin;
  }
  else {
    in_00 = local_210;
  }
  local_428 = in_00;
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    err = (ErrorHandler)&std::cout;
  }
  else {
    err = (ErrorHandler)local_410;
  }
  local_430 = err;
  Potassco::AspifTextOutput::AspifTextOutput(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  ext = (undefined1)((ulong)in_stack_fffffffffffffb00 >> 0x38);
  iVar3 = std::istream::peek();
  if (iVar3 != 0x61) {
    iVar3 = std::istream::peek();
    iVar3 = isdigit(iVar3);
    if (iVar3 == 0) {
      Potassco::fail(-3,"virtual void LpConvert::run()",0x65,
                     "in.peek() == \'a\' || std::isdigit(in.peek())","Unrecognized input format!",0)
      ;
    }
  }
  iVar3 = std::istream::peek();
  if (iVar3 == 0x61) {
    Potassco::SmodelsOutput::SmodelsOutput
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               SUB81((ulong)in_stack_fffffffffffffae0 >> 0x38,0),(Atom_t)in_stack_fffffffffffffae0);
    Potassco::SmodelsConvert::SmodelsConvert
              ((SmodelsConvert *)CONCAT44(iVar3,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08
               ,(bool)ext);
    Potassco::readAspif(in_00,(AbstractProgram *)CONCAT17(bVar2,in_stack_fffffffffffffb28),err);
    Potassco::SmodelsConvert::~SmodelsConvert((SmodelsConvert *)in_stack_fffffffffffffae0);
    Potassco::SmodelsOutput::~SmodelsOutput((SmodelsOutput *)0x108252);
  }
  else {
    Potassco::AspifOutput::AspifOutput
              ((AspifOutput *)in_stack_fffffffffffffae0,(ostream *)in_stack_fffffffffffffad8);
    Potassco::SmodelsInput::Options::Options(&local_4b4);
    if (((byte)in_RDI[0x68] & 1) != 0) {
      pOVar6 = Potassco::SmodelsInput::Options::enableClaspExt(&local_4b4);
      pOVar6 = Potassco::SmodelsInput::Options::convertEdges(pOVar6);
      Potassco::SmodelsInput::Options::convertHeuristic(pOVar6);
      if (((byte)in_RDI[0x69] & 1) != 0) {
        Potassco::SmodelsInput::Options::dropConverted(&local_4b4);
      }
    }
    if (((byte)in_RDI[0x6a] & 1) == 0) {
      in_stack_fffffffffffffae0 = &local_4b0;
    }
    else {
      in_stack_fffffffffffffae0 = &local_460;
    }
    Potassco::readSmodels
              (in_RDI,(AbstractProgram *)
                      CONCAT17(in_stack_fffffffffffffb3f,
                               CONCAT16(in_stack_fffffffffffffb3e,
                                        CONCAT15(in_stack_fffffffffffffb3d,
                                                 CONCAT14(in_stack_fffffffffffffb3c,uVar7)))),
               (ErrorHandler)in_00,(Options *)CONCAT17(bVar2,in_stack_fffffffffffffb28));
    Potassco::AspifOutput::~AspifOutput((AspifOutput *)0x108391);
  }
  std::ifstream::close();
  std::ofstream::close();
  Potassco::AspifTextOutput::~AspifTextOutput(in_stack_fffffffffffffae0);
  std::ofstream::~ofstream(local_410);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void LpConvert::run() {
	std::ifstream iFile;
	std::ofstream oFile;
	if (!input_.empty() && input_ != "-") {
		iFile.open(input_.c_str());
		POTASSCO_EXPECT(iFile.is_open(), "Could not open input file!");
	}
	if (!output_.empty() && output_ != "-") {
		POTASSCO_EXPECT(input_ != output_, "Input and output must be different!");
		oFile.open(output_.c_str());
		POTASSCO_EXPECT(oFile.is_open(), "Could not open output file!");
	}
	std::istream& in = iFile.is_open() ? iFile : std::cin;
	std::ostream& os = oFile.is_open() ? oFile : std::cout;
	Potassco::AspifTextOutput text(os);
	POTASSCO_EXPECT(in.peek() == 'a' || std::isdigit(in.peek()), "Unrecognized input format!");
	if (in.peek() == 'a') {
		Potassco::SmodelsOutput  writer(os, potassco_, 0);
		Potassco::SmodelsConvert smodels(writer, potassco_);
		Potassco::readAspif(in, !text_ ? static_cast<Potassco::AbstractProgram&>(smodels) : text, &error);
	}
	else {
		Potassco::AspifOutput aspif(os);
		Potassco::SmodelsInput::Options opts;
		if (potassco_) {
			opts.enableClaspExt().convertEdges().convertHeuristic();
			if (filter_) { opts.dropConverted(); }
		}
		Potassco::readSmodels(in, !text_? static_cast<Potassco::AbstractProgram&>(aspif) : text, &error, opts);
	}
	iFile.close();
	oFile.close();
}